

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O1

void __thiscall Lodtalk::VMHeap::initialize(VMHeap *this)

{
  size_t sVar1;
  uint8_t *puVar2;
  
  sVar1 = sysconf(0x1e);
  if (sVar1 == 0xffffffffffffffff) {
    initialize();
  }
  else {
    this->pageSize = sVar1;
    this->maxCapacity = 0x400000000;
    this->capacity = 0;
    this->size = 0;
    puVar2 = (uint8_t *)mmap((void *)0x0,0x400000000,0,0x22,-1,0);
    if (puVar2 == (uint8_t *)0xffffffffffffffff) {
      puVar2 = (uint8_t *)0x0;
    }
    this->addressSpace = puVar2;
    if (puVar2 != (uint8_t *)0x0) {
      return;
    }
  }
  initialize();
  return;
}

Assistant:

void VMHeap::initialize()
{
    // Get the page size.
    pageSize = getPageSize();

    // Allocate the virtual address space.
    maxCapacity = DefaultMaxVMHeapSize;
    capacity = 0;
    size = 0;
    addressSpace = reserveVirtualAddressSpace(maxCapacity);
    if(!addressSpace)
    {
        fprintf(stderr, "Failed to reserve the VM heap memory address space.\n");
        abort();
    }
}